

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

string * StripAnsiEscapeCodes(string *__return_storage_ptr__,string *in)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar2 = in->_M_string_length;
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      pcVar1 = (in->_M_dataplus)._M_p;
      if (pcVar1[uVar4] == '\x1b') {
        if (uVar2 <= uVar4 + 1) {
          return __return_storage_ptr__;
        }
        if ((pcVar1[uVar4 + 1] == '[') && (uVar3 = uVar4 + 2, uVar4 = uVar3, uVar3 < uVar2)) {
          do {
            uVar4 = uVar3;
            if (((int)pcVar1[uVar3] & 0xffffffdfU) - 0x41 < 0x1a) break;
            uVar3 = uVar3 + 1;
            uVar4 = uVar2;
          } while (uVar2 != uVar3);
        }
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar2 = in->_M_string_length;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string StripAnsiEscapeCodes(const string& in) {
  string stripped;
  stripped.reserve(in.size());

  for (size_t i = 0; i < in.size(); ++i) {
    if (in[i] != '\33') {
      // Not an escape code.
      stripped.push_back(in[i]);
      continue;
    }

    // Only strip CSIs for now.
    if (i + 1 >= in.size()) break;
    if (in[i + 1] != '[') continue;  // Not a CSI.
    i += 2;

    // Skip everything up to and including the next [a-zA-Z].
    while (i < in.size() && !islatinalpha(in[i]))
      ++i;
  }
  return stripped;
}